

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int aura_node_buffer_pool_gc_once(aura_node *pos)

{
  list_head *plVar1;
  bool bVar2;
  list_head *__mptr;
  aura_buffer *buf;
  aura_node *pos_local;
  
  bVar2 = pos->gc_threshold <= pos->num_buffers_in_pool;
  if (bVar2) {
    pos->num_buffers_in_pool = pos->num_buffers_in_pool + -1;
    plVar1 = (pos->buffer_pool).prev;
    list_del((pos->buffer_pool).prev);
    aura_buffer_destroy((aura_buffer *)(plVar1 + -2));
  }
  pos_local._4_4_ = (uint)bVar2;
  return pos_local._4_4_;
}

Assistant:

int aura_node_buffer_pool_gc_once(struct aura_node *pos)
{
	/* GC: Ditch one last buffer from pool if we have too many */
	if (pos->num_buffers_in_pool >= pos->gc_threshold) {
		struct aura_buffer *buf;
		pos->num_buffers_in_pool--;
		buf = list_entry(pos->buffer_pool.prev, struct aura_buffer, qentry);
		list_del(pos->buffer_pool.prev);
		aura_buffer_destroy(buf);
		return 1;
	}
	return 0;
}